

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# si_function.hpp
# Opt level: O0

double __thiscall
sisl::si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3>::operator()
          (si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> *this,vector *p)

{
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_70;
  Matrix<double,__1,_1,_0,__1,_1> local_60 [2];
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_40;
  Matrix<double,__1,_1,_0,__1,_1> local_30;
  vector *local_20;
  vector *p_local;
  si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> *this_local;
  
  if (this->_lattice == (cartesian_cubic<float> *)0x0) {
    this_local = (si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> *)0x0;
  }
  else {
    local_20 = p;
    p_local = (vector *)this;
    if ((this->_bForceScale & 1U) == 0) {
      local_40 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                            &this->_mSpaceTransform,
                            (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)p);
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                ((Matrix<double,_1,1,0,_1,1> *)&local_30,
                 (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                  *)&local_40);
      this_local = (si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> *)
                   tp_linear::convolution_sum<3,sisl::cartesian_cubic<float>,sisl::tp_linear>
                             ((vector *)&local_30,this->_lattice);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_30);
    }
    else {
      local_70 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                            &this->_mSpaceTransform,
                            (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)p);
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                ((Matrix<double,_1,1,0,_1,1> *)local_60,
                 (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                  *)&local_70);
      this_local = (si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> *)
                   tp_linear::convolution_sum_h<3,sisl::cartesian_cubic<float>,sisl::tp_linear>
                             ((vector *)local_60,this->_lattice,&this->_dBasisScale);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(local_60);
    }
  }
  return (double)this_local;
}

Assistant:

virtual const double operator()(const vector &p) const {
            if(_lattice == nullptr) return 0;

            if(!_bForceScale) {
                return BF::template convolution_sum<N, L, BF>(
                            _mSpaceTransform*p,
                            (const L*)_lattice);
            }
            return BF::template convolution_sum_h<N, L, BF>(
                        _mSpaceTransform*p,
                        (const L*)_lattice,
                        _dBasisScale);
        }